

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_InternalSessionCache_Test::TestBody
          (SSLTest_InternalSessionCache_Test *this)

{
  initializer_list<ssl_session_st_*> __l;
  initializer_list<ssl_session_st_*> __l_00;
  initializer_list<ssl_session_st_*> __l_01;
  initializer_list<ssl_session_st_*> __l_02;
  initializer_list<ssl_session_st_*> __l_03;
  bool bVar1;
  int iVar2;
  SSL_METHOD *meth;
  pointer psVar3;
  char *pcVar4;
  reference pvVar5;
  SSL_SESSION *pSVar6;
  char *in_R9;
  string local_600;
  AssertHelper local_5e0;
  Message local_5d8;
  allocator<ssl_session_st_*> local_5c9;
  pointer local_5c8;
  pointer local_5c0;
  pointer local_5b8;
  pointer local_5b0;
  iterator local_5a8;
  size_type local_5a0;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> local_598;
  bool local_579;
  undefined1 local_578 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_548;
  Message local_540;
  bool local_531;
  undefined1 local_530 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_500;
  Message local_4f8;
  bool local_4e9;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_4b8;
  Message local_4b0;
  allocator<ssl_session_st_*> local_4a1;
  pointer local_4a0;
  pointer local_498;
  pointer local_490;
  pointer local_488;
  iterator local_480;
  size_type local_478;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> local_470;
  bool local_451;
  undefined1 local_450 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_420;
  Message local_418;
  int local_40c;
  undefined1 local_408 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_3d8;
  Message local_3d0;
  allocator<ssl_session_st_*> local_3c1;
  pointer local_3c0;
  pointer local_3b8;
  pointer local_3b0;
  pointer local_3a8;
  pointer local_3a0;
  iterator local_398;
  size_type local_390;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> local_388;
  bool local_369;
  undefined1 local_368 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_338;
  Message local_330;
  int local_324;
  undefined1 local_320 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_2f0;
  Message local_2e8;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar__6;
  UniquePtr<SSL_SESSION> collision;
  AssertHelper local_2a8;
  Message local_2a0;
  allocator<ssl_session_st_*> local_291;
  pointer local_290;
  pointer local_288;
  pointer local_280;
  pointer local_278;
  pointer local_270;
  iterator local_268;
  size_type local_260;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> local_258;
  bool local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_208;
  Message local_200;
  bool local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1c0;
  Message local_1b8;
  allocator<ssl_session_st_*> local_1a9;
  pointer local_1a8;
  pointer local_1a0;
  pointer local_198;
  pointer local_190;
  pointer local_188;
  iterator local_180;
  size_type local_178;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> local_170;
  bool local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_120;
  Message local_118;
  int local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar__2;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> *session_1;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
  *__range2;
  AssertHelper local_b8;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<SSL_SESSION> session;
  undefined1 local_88 [4];
  int i;
  vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
  sessions;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<SSL_CTX> ctx;
  SSLTest_InternalSessionCache_Test *this_local;
  
  meth = (SSL_METHOD *)TLS_method();
  psVar3 = (pointer)SSL_CTX_new(meth);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar_.message_,psVar3);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x4d86cd,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xa66,pcVar4);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  sessions.
  super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
  sessions.
  super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (sessions.
      super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    std::
    vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
    ::vector((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
              *)local_88);
    for (session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ = 0;
        (int)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ < 10;
        session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ =
             session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ + 1) {
      CreateTestSession((anon_unknown_0 *)&gtest_ar__1.message_,
                        session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_);
      testing::AssertionResult::
      AssertionResult<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_a8,
                 (unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,
                 (type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
      if (!bVar1) {
        testing::Message::Message(&local_b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&__range2,(internal *)local_a8,(AssertionResult *)0x4f1864,"false",
                   "true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xa6c,pcVar4);
        testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_b8);
        std::__cxx11::string::~string((string *)&__range2);
        testing::Message::~Message(&local_b0);
      }
      sessions.
      super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      sessions.
      super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
      if (sessions.
          super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        std::
        vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
        ::push_back((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                     *)local_88,(value_type *)&gtest_ar__1.message_);
        sessions.
        super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
      if (sessions.
          super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_00196d18;
    }
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    SSL_CTX_sess_set_cache_size(psVar3,5);
    __end2 = std::
             vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
             ::begin((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                      *)local_88);
    session_1 = (unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                std::
                vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                ::end((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                       *)local_88);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_*,_std::vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>_>
                                       *)&session_1), bVar1) {
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )__gnu_cxx::
             __normal_iterator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_*,_std::vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>_>
             ::operator*(&__end2);
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      pSVar6 = (SSL_SESSION *)
               std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                          gtest_ar__2.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
      local_10c = SSL_CTX_add_session((SSL_CTX *)psVar3,pSVar6);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_108,&local_10c,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
      if (!bVar1) {
        testing::Message::Message(&local_118);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_108,
                   (AssertionResult *)"SSL_CTX_add_session(ctx.get(), session.get())","false","true"
                   ,in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_120,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xa74,pcVar4);
        testing::internal::AssertHelper::operator=(&local_120,&local_118);
        testing::internal::AssertHelper::~AssertHelper(&local_120);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_118);
      }
      sessions.
      super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      sessions.
      super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
      if (sessions.
          super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_00196d18;
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_*,_std::vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>_>
      ::operator++(&__end2);
    }
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    pvVar5 = std::
             vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
             ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                           *)local_88,9);
    local_1a8 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
    pvVar5 = std::
             vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
             ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                           *)local_88,8);
    local_1a0 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
    pvVar5 = std::
             vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
             ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                           *)local_88,7);
    local_198 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
    pvVar5 = std::
             vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
             ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                           *)local_88,6);
    local_190 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
    pvVar5 = std::
             vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
             ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                           *)local_88,5);
    local_188 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
    local_180 = &local_1a8;
    local_178 = 5;
    std::allocator<ssl_session_st_*>::allocator(&local_1a9);
    __l_03._M_len = local_178;
    __l_03._M_array = local_180;
    std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
              (&local_170,__l_03,&local_1a9);
    local_151 = CacheEquals(psVar3,&local_170);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_150,&local_151,(type *)0x0);
    std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::~vector(&local_170);
    std::allocator<ssl_session_st_*>::~allocator(&local_1a9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
    if (!bVar1) {
      testing::Message::Message(&local_1b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__4.message_,(internal *)local_150,
                 (AssertionResult *)
                 "CacheEquals( ctx.get(), {sessions[9].get(), sessions[8].get(), sessions[7].get(), sessions[6].get(), sessions[5].get()})"
                 ,"false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xa7a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
      testing::Message::~Message(&local_1b8);
    }
    sessions.
    super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
    sessions.
    super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
    if (sessions.
        super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      pvVar5 = std::
               vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
               ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                             *)local_88,7);
      pSVar6 = (SSL_SESSION *)std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
      iVar2 = SSL_CTX_add_session((SSL_CTX *)psVar3,pSVar6);
      local_1f1 = iVar2 == 0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1f0,&local_1f1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
      if (!bVar1) {
        testing::Message::Message(&local_200);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__5.message_,(internal *)local_1f0,
                   (AssertionResult *)"SSL_CTX_add_session(ctx.get(), sessions[7].get())","true",
                   "false",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_208,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xa7e,pcVar4);
        testing::internal::AssertHelper::operator=(&local_208,&local_200);
        testing::internal::AssertHelper::~AssertHelper(&local_208);
        std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
        testing::Message::~Message(&local_200);
      }
      sessions.
      super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      sessions.
      super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
      if (sessions.
          super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        pvVar5 = std::
                 vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                 ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                               *)local_88,9);
        local_290 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
        pvVar5 = std::
                 vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                 ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                               *)local_88,8);
        local_288 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
        pvVar5 = std::
                 vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                 ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                               *)local_88,7);
        local_280 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
        pvVar5 = std::
                 vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                 ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                               *)local_88,6);
        local_278 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
        pvVar5 = std::
                 vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                 ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                               *)local_88,5);
        local_270 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
        local_268 = &local_290;
        local_260 = 5;
        std::allocator<ssl_session_st_*>::allocator(&local_291);
        __l_02._M_len = local_260;
        __l_02._M_array = local_268;
        std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
                  (&local_258,__l_02,&local_291);
        local_239 = CacheEquals(psVar3,&local_258);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_238,&local_239,(type *)0x0);
        std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::~vector(&local_258);
        std::allocator<ssl_session_st_*>::~allocator(&local_291);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
        if (!bVar1) {
          testing::Message::Message(&local_2a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&collision,(internal *)local_238,
                     (AssertionResult *)
                     "CacheEquals( ctx.get(), {sessions[9].get(), sessions[8].get(), sessions[7].get(), sessions[6].get(), sessions[5].get()})"
                     ,"false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_2a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xa81,pcVar4);
          testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
          testing::internal::AssertHelper::~AssertHelper(&local_2a8);
          std::__cxx11::string::~string((string *)&collision);
          testing::Message::~Message(&local_2a0);
        }
        sessions.
        super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
        sessions.
        super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
        if (sessions.
            super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
          CreateTestSession((anon_unknown_0 *)&gtest_ar__6.message_,7);
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_2e0,
                     (unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_,
                     (type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
          if (!bVar1) {
            testing::Message::Message(&local_2e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__7.message_,(internal *)local_2e0,
                       (AssertionResult *)"collision","false","true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_2f0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xa86,pcVar4);
            testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
            testing::internal::AssertHelper::~AssertHelper(&local_2f0);
            std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
            testing::Message::~Message(&local_2e8);
          }
          sessions.
          super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
          sessions.
          super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
          if (sessions.
              super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
            psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            pSVar6 = (SSL_SESSION *)
                     std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                                &gtest_ar__6.message_);
            local_324 = SSL_CTX_add_session((SSL_CTX *)psVar3,pSVar6);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_320,&local_324,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
            if (!bVar1) {
              testing::Message::Message(&local_330);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__8.message_,(internal *)local_320,
                         (AssertionResult *)"SSL_CTX_add_session(ctx.get(), collision.get())",
                         "false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_338,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xa87,pcVar4);
              testing::internal::AssertHelper::operator=(&local_338,&local_330);
              testing::internal::AssertHelper::~AssertHelper(&local_338);
              std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
              testing::Message::~Message(&local_330);
            }
            sessions.
            super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
            sessions.
            super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
            if (sessions.
                super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
              psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              local_3c0 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__6.message_);
              pvVar5 = std::
                       vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                       ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                                     *)local_88,9);
              local_3b8 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
              pvVar5 = std::
                       vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                       ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                                     *)local_88,8);
              local_3b0 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
              pvVar5 = std::
                       vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                       ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                                     *)local_88,6);
              local_3a8 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
              pvVar5 = std::
                       vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                       ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                                     *)local_88,5);
              local_3a0 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
              local_398 = &local_3c0;
              local_390 = 5;
              std::allocator<ssl_session_st_*>::allocator(&local_3c1);
              __l_01._M_len = local_390;
              __l_01._M_array = local_398;
              std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
                        (&local_388,__l_01,&local_3c1);
              local_369 = CacheEquals(psVar3,&local_388);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_368,&local_369,(type *)0x0);
              std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::~vector(&local_388);
              std::allocator<ssl_session_st_*>::~allocator(&local_3c1);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
              if (!bVar1) {
                testing::Message::Message(&local_3d0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__9.message_,(internal *)local_368,
                           (AssertionResult *)
                           "CacheEquals( ctx.get(), {collision.get(), sessions[9].get(), sessions[8].get(), sessions[6].get(), sessions[5].get()})"
                           ,"false","true",in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_3d8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xa8a,pcVar4);
                testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
                testing::internal::AssertHelper::~AssertHelper(&local_3d8);
                std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                testing::Message::~Message(&local_3d0);
              }
              sessions.
              super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
              sessions.
              super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
              if (sessions.
                  super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
                psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                pvVar5 = std::
                         vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                         ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                                       *)local_88,6);
                pSVar6 = (SSL_SESSION *)
                         std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
                local_40c = SSL_CTX_remove_session((SSL_CTX *)psVar3,pSVar6);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_408,&local_40c,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_408);
                if (!bVar1) {
                  testing::Message::Message(&local_418);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__10.message_,(internal *)local_408,
                             (AssertionResult *)
                             "SSL_CTX_remove_session(ctx.get(), sessions[6].get())","false","true",
                             in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_420,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xa8d,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_420,&local_418);
                  testing::internal::AssertHelper::~AssertHelper(&local_420);
                  std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                  testing::Message::~Message(&local_418);
                }
                sessions.
                super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
                sessions.
                super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
                if (sessions.
                    super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
                  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                      &gtest_ar_.message_);
                  local_4a0 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                                        ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                                         &gtest_ar__6.message_);
                  pvVar5 = std::
                           vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                           ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                                         *)local_88,9);
                  local_498 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
                  pvVar5 = std::
                           vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                           ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                                         *)local_88,8);
                  local_490 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
                  pvVar5 = std::
                           vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                           ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                                         *)local_88,5);
                  local_488 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
                  local_480 = &local_4a0;
                  local_478 = 4;
                  std::allocator<ssl_session_st_*>::allocator(&local_4a1);
                  __l_00._M_len = local_478;
                  __l_00._M_array = local_480;
                  std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
                            (&local_470,__l_00,&local_4a1);
                  local_451 = CacheEquals(psVar3,&local_470);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_450,&local_451,(type *)0x0);
                  std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::~vector
                            (&local_470);
                  std::allocator<ssl_session_st_*>::~allocator(&local_4a1);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_450);
                  if (!bVar1) {
                    testing::Message::Message(&local_4b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__11.message_,(internal *)local_450,
                               (AssertionResult *)
                               "CacheEquals(ctx.get(), {collision.get(), sessions[9].get(), sessions[8].get(), sessions[5].get()})"
                               ,"false","true",in_R9);
                    pcVar4 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_4b8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0xa8f,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
                    testing::internal::AssertHelper::~AssertHelper(&local_4b8);
                    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
                    testing::Message::~Message(&local_4b0);
                  }
                  sessions.
                  super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
                  sessions.
                  super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
                  if (sessions.
                      super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
                    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    pvVar5 = std::
                             vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                             ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                                           *)local_88,0);
                    pSVar6 = (SSL_SESSION *)
                             std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5);
                    iVar2 = SSL_CTX_remove_session((SSL_CTX *)psVar3,pSVar6);
                    local_4e9 = iVar2 == 0;
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_4e8,&local_4e9,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_4e8);
                    if (!bVar1) {
                      testing::Message::Message(&local_4f8);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__12.message_,(internal *)local_4e8,
                                 (AssertionResult *)
                                 "SSL_CTX_remove_session(ctx.get(), sessions[0].get())","true",
                                 "false",in_R9);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_500,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0xa92,pcVar4);
                      testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
                      testing::internal::AssertHelper::~AssertHelper(&local_500);
                      std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                      testing::Message::~Message(&local_4f8);
                    }
                    sessions.
                    super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
                    sessions.
                    super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
                    if (sessions.
                        super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
                      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                          &gtest_ar_.message_);
                      pvVar5 = std::
                               vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                               ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                                             *)local_88,7);
                      pSVar6 = (SSL_SESSION *)
                               std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(pvVar5)
                      ;
                      iVar2 = SSL_CTX_remove_session((SSL_CTX *)psVar3,pSVar6);
                      local_531 = iVar2 == 0;
                      testing::AssertionResult::AssertionResult<bool>
                                ((AssertionResult *)local_530,&local_531,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_530);
                      if (!bVar1) {
                        testing::Message::Message(&local_540);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__13.message_,(internal *)local_530,
                                   (AssertionResult *)
                                   "SSL_CTX_remove_session(ctx.get(), sessions[7].get())","true",
                                   "false",in_R9);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_548,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0xa93,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_548,&local_540);
                        testing::internal::AssertHelper::~AssertHelper(&local_548);
                        std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                        testing::Message::~Message(&local_540);
                      }
                      sessions.
                      super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
                      sessions.
                      super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
                      if (sessions.
                          super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
                        psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                            &gtest_ar_.message_);
                        local_5c8 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                                              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter>
                                                *)&gtest_ar__6.message_);
                        pvVar5 = std::
                                 vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                                 ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                                               *)local_88,9);
                        local_5c0 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                                              (pvVar5);
                        pvVar5 = std::
                                 vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                                 ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                                               *)local_88,8);
                        local_5b8 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                                              (pvVar5);
                        pvVar5 = std::
                                 vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                                 ::operator[]((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                                               *)local_88,5);
                        local_5b0 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                                              (pvVar5);
                        local_5a8 = &local_5c8;
                        local_5a0 = 4;
                        std::allocator<ssl_session_st_*>::allocator(&local_5c9);
                        __l._M_len = local_5a0;
                        __l._M_array = local_5a8;
                        std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
                                  (&local_598,__l,&local_5c9);
                        local_579 = CacheEquals(psVar3,&local_598);
                        testing::AssertionResult::AssertionResult<bool>
                                  ((AssertionResult *)local_578,&local_579,(type *)0x0);
                        std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::~vector
                                  (&local_598);
                        std::allocator<ssl_session_st_*>::~allocator(&local_5c9);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_578);
                        if (!bVar1) {
                          testing::Message::Message(&local_5d8);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    (&local_600,(internal *)local_578,
                                     (AssertionResult *)
                                     "CacheEquals(ctx.get(), {collision.get(), sessions[9].get(), sessions[8].get(), sessions[5].get()})"
                                     ,"false","true",in_R9);
                          pcVar4 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_5e0,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                     ,0xa97,pcVar4);
                          testing::internal::AssertHelper::operator=(&local_5e0,&local_5d8);
                          testing::internal::AssertHelper::~AssertHelper(&local_5e0);
                          std::__cxx11::string::~string((string *)&local_600);
                          testing::Message::~Message(&local_5d8);
                        }
                        sessions.
                        super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
                        sessions.
                        super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
                        if (sessions.
                            super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
                          sessions.
                          super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_);
        }
      }
    }
LAB_00196d18:
    std::
    vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
    ::~vector((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
               *)local_88);
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SSLTest, InternalSessionCache) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);

  // Prepare 10 test sessions.
  std::vector<bssl::UniquePtr<SSL_SESSION>> sessions;
  for (int i = 0; i < 10; i++) {
    bssl::UniquePtr<SSL_SESSION> session = CreateTestSession(i);
    ASSERT_TRUE(session);
    sessions.push_back(std::move(session));
  }

  SSL_CTX_sess_set_cache_size(ctx.get(), 5);

  // Insert all the test sessions.
  for (const auto &session : sessions) {
    ASSERT_TRUE(SSL_CTX_add_session(ctx.get(), session.get()));
  }

  // Only the last five should be in the list.
  ASSERT_TRUE(CacheEquals(
      ctx.get(), {sessions[9].get(), sessions[8].get(), sessions[7].get(),
                  sessions[6].get(), sessions[5].get()}));

  // Inserting an element already in the cache should fail and leave the cache
  // unchanged.
  ASSERT_FALSE(SSL_CTX_add_session(ctx.get(), sessions[7].get()));
  ASSERT_TRUE(CacheEquals(
      ctx.get(), {sessions[9].get(), sessions[8].get(), sessions[7].get(),
                  sessions[6].get(), sessions[5].get()}));

  // Although collisions should be impossible (256-bit session IDs), the cache
  // must handle them gracefully.
  bssl::UniquePtr<SSL_SESSION> collision(CreateTestSession(7));
  ASSERT_TRUE(collision);
  ASSERT_TRUE(SSL_CTX_add_session(ctx.get(), collision.get()));
  ASSERT_TRUE(CacheEquals(
      ctx.get(), {collision.get(), sessions[9].get(), sessions[8].get(),
                  sessions[6].get(), sessions[5].get()}));

  // Removing sessions behaves correctly.
  ASSERT_TRUE(SSL_CTX_remove_session(ctx.get(), sessions[6].get()));
  ASSERT_TRUE(CacheEquals(ctx.get(), {collision.get(), sessions[9].get(),
                                      sessions[8].get(), sessions[5].get()}));

  // Removing sessions requires an exact match.
  ASSERT_FALSE(SSL_CTX_remove_session(ctx.get(), sessions[0].get()));
  ASSERT_FALSE(SSL_CTX_remove_session(ctx.get(), sessions[7].get()));

  // The cache remains unchanged.
  ASSERT_TRUE(CacheEquals(ctx.get(), {collision.get(), sessions[9].get(),
                                      sessions[8].get(), sessions[5].get()}));
}